

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode Curl_ossl_certchain(Curl_easy *data,SSL *ssl)

{
  Curl_easy *pCVar1;
  int iVar2;
  CURLcode CVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  BIO_METHOD *pBVar7;
  BIO *a;
  X509 *pXVar8;
  X509_NAME *pXVar9;
  size_t sVar10;
  undefined8 uVar11;
  ASN1_INTEGER *pAVar12;
  X509_PUBKEY *pub;
  X509_EXTENSION *ex;
  BIO *out;
  ASN1_OBJECT *a_00;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar13;
  EVP_PKEY *pkey;
  stack_st_X509 *psVar14;
  long lVar15;
  char *type;
  char *ptr;
  Curl_easy *local_f8;
  BUF_MEM *biomem;
  ASN1_OBJECT *pubkeyoid;
  X509_ALGOR *sigalg;
  X509 *local_d8;
  ASN1_BIT_STRING *psig;
  int local_c4;
  stack_st_X509 *local_c0;
  BIGNUM *n;
  
  local_f8 = data;
  local_c0 = SSL_get_peer_cert_chain((SSL *)ssl);
  CVar3 = CURLE_OUT_OF_MEMORY;
  if (local_c0 != (stack_st_X509 *)0x0) {
    iVar2 = OPENSSL_sk_num(local_c0);
    CVar3 = Curl_ssl_init_certinfo(local_f8,iVar2);
    if (CVar3 == CURLE_OK) {
      pBVar7 = BIO_s_mem();
      a = BIO_new(pBVar7);
      CVar3 = CURLE_OUT_OF_MEMORY;
      if (a != (BIO *)0x0) {
        local_c4 = iVar2;
        if (iVar2 < 1) {
          local_c4 = 0;
        }
        psVar14 = local_c0;
        for (iVar2 = 0; iVar2 != local_c4; iVar2 = iVar2 + 1) {
          pXVar8 = (X509 *)OPENSSL_sk_value(psVar14,iVar2);
          psig = (ASN1_BIT_STRING *)0x0;
          pXVar9 = X509_get_subject_name(pXVar8);
          X509_NAME_print_ex(a,pXVar9,0,0x82031f);
          sVar10 = BIO_ctrl(a,3,0,&ptr);
          pCVar1 = local_f8;
          Curl_ssl_push_certinfo_len(local_f8,iVar2,"Subject",ptr,sVar10);
          BIO_ctrl(a,1,0,(void *)0x0);
          pXVar9 = X509_get_issuer_name(pXVar8);
          X509_NAME_print_ex(a,pXVar9,0,0x82031f);
          sVar10 = BIO_ctrl(a,3,0,&ptr);
          Curl_ssl_push_certinfo_len(pCVar1,iVar2,"Issuer",ptr,sVar10);
          BIO_ctrl(a,1,0,(void *)0x0);
          uVar11 = X509_get_version(pXVar8);
          BIO_printf(a,"%lx",uVar11);
          sVar10 = BIO_ctrl(a,3,0,&ptr);
          Curl_ssl_push_certinfo_len(pCVar1,iVar2,"Version",ptr,sVar10);
          BIO_ctrl(a,1,0,(void *)0x0);
          local_d8 = pXVar8;
          pAVar12 = X509_get_serialNumber(pXVar8);
          if (pAVar12->type == 0x102) {
            BIO_puts(a,"-");
          }
          for (lVar15 = 0; lVar15 < pAVar12->length; lVar15 = lVar15 + 1) {
            BIO_printf(a,"%02x",(ulong)pAVar12->data[lVar15]);
          }
          sVar10 = BIO_ctrl(a,3,0,&ptr);
          Curl_ssl_push_certinfo_len(local_f8,iVar2,"Serial Number",ptr,sVar10);
          BIO_ctrl(a,1,0,(void *)0x0);
          sigalg = (X509_ALGOR *)0x0;
          pubkeyoid = (ASN1_OBJECT *)0x0;
          X509_get0_signature(&psig,&sigalg,local_d8);
          if (sigalg != (X509_ALGOR *)0x0) {
            i2a_ASN1_OBJECT(a,(ASN1_OBJECT *)sigalg->algorithm);
            sVar10 = BIO_ctrl(a,3,0,&ptr);
            Curl_ssl_push_certinfo_len(local_f8,iVar2,"Signature Algorithm",ptr,sVar10);
            BIO_ctrl(a,1,0,(void *)0x0);
          }
          pub = (X509_PUBKEY *)X509_get_X509_PUBKEY(local_d8);
          if ((pub != (X509_PUBKEY *)0x0) &&
             (X509_PUBKEY_get0_param
                        ((ASN1_OBJECT **)&pubkeyoid,(uchar **)0x0,(int *)0x0,(X509_ALGOR **)0x0,pub)
             , pubkeyoid != (ASN1_OBJECT *)0x0)) {
            i2a_ASN1_OBJECT(a,(ASN1_OBJECT *)pubkeyoid);
            sVar10 = BIO_ctrl(a,3,0,&ptr);
            Curl_ssl_push_certinfo_len(local_f8,iVar2,"Public Key Algorithm",ptr,sVar10);
            BIO_ctrl(a,1,0,(void *)0x0);
          }
          uVar11 = X509_get0_extensions(local_d8);
          iVar4 = OPENSSL_sk_num(uVar11);
          if (0 < iVar4) {
            for (iVar4 = 0; iVar5 = OPENSSL_sk_num(uVar11), iVar4 < iVar5; iVar4 = iVar4 + 1) {
              ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar11,iVar4);
              pBVar7 = BIO_s_mem();
              out = BIO_new(pBVar7);
              if (out == (BIO *)0x0) break;
              a_00 = X509_EXTENSION_get_object(ex);
              i2t_ASN1_OBJECT((char *)&n,0x80,a_00);
              iVar5 = X509V3_EXT_print(out,ex,0,0);
              if (iVar5 == 0) {
                v = X509_EXTENSION_get_data(ex);
                ASN1_STRING_print(out,v);
              }
              BIO_ctrl(out,0x73,0,&biomem);
              Curl_ssl_push_certinfo_len(local_f8,iVar2,(char *)&n,biomem->data,biomem->length);
              BIO_free(out);
            }
          }
          pXVar8 = local_d8;
          pAVar13 = (ASN1_TIME *)X509_get0_notBefore(local_d8);
          ASN1_TIME_print(a,pAVar13);
          sVar10 = BIO_ctrl(a,3,0,&ptr);
          pCVar1 = local_f8;
          Curl_ssl_push_certinfo_len(local_f8,iVar2,"Start date",ptr,sVar10);
          BIO_ctrl(a,1,0,(void *)0x0);
          pAVar13 = (ASN1_TIME *)X509_get0_notAfter(pXVar8);
          ASN1_TIME_print(a,pAVar13);
          sVar10 = BIO_ctrl(a,3,0,&ptr);
          Curl_ssl_push_certinfo_len(pCVar1,iVar2,"Expire date",ptr,sVar10);
          BIO_ctrl(a,1,0,(void *)0x0);
          pkey = X509_get_pubkey(pXVar8);
          if (pkey == (EVP_PKEY *)0x0) {
            Curl_infof(local_f8,"   Unable to load public key");
          }
          else {
            iVar4 = EVP_PKEY_get_id(pkey);
            if (iVar4 == 0x74) {
              n = (BIGNUM *)0x0;
              biomem = (BUF_MEM *)0x0;
              sigalg = (X509_ALGOR *)0x0;
              pubkeyoid = (ASN1_OBJECT *)0x0;
              EVP_PKEY_get_bn_param(pkey,"p",&n);
              EVP_PKEY_get_bn_param(pkey,"q",&biomem);
              EVP_PKEY_get_bn_param(pkey,"g",&sigalg);
              EVP_PKEY_get_bn_param(pkey,"pub",&pubkeyoid);
              type = "dsa";
LAB_00458e38:
              pCVar1 = local_f8;
              pubkey_show(local_f8,(BIO *)a,iVar2,type,"p",n);
              pubkey_show(pCVar1,(BIO *)a,iVar2,type,"q",(BIGNUM *)biomem);
              pubkey_show(pCVar1,(BIO *)a,iVar2,type,"g",(BIGNUM *)sigalg);
              pubkey_show(pCVar1,(BIO *)a,iVar2,type,"pub_key",(BIGNUM *)pubkeyoid);
              BN_clear_free((BIGNUM *)n);
              BN_clear_free((BIGNUM *)biomem);
              BN_clear_free((BIGNUM *)sigalg);
              BN_clear_free((BIGNUM *)pubkeyoid);
            }
            else {
              if (iVar4 == 0x1c) {
                n = (BIGNUM *)0x0;
                biomem = (BUF_MEM *)0x0;
                sigalg = (X509_ALGOR *)0x0;
                pubkeyoid = (ASN1_OBJECT *)0x0;
                EVP_PKEY_get_bn_param(pkey,"p",&n);
                EVP_PKEY_get_bn_param(pkey,"q",&biomem);
                EVP_PKEY_get_bn_param(pkey,"g",&sigalg);
                EVP_PKEY_get_bn_param(pkey,"pub",&pubkeyoid);
                type = "dh";
                goto LAB_00458e38;
              }
              if (iVar4 == 6) {
                n = (BIGNUM *)0x0;
                biomem = (BUF_MEM *)0x0;
                EVP_PKEY_get_bn_param(pkey,"n",&n);
                EVP_PKEY_get_bn_param(pkey,"e",&biomem);
                uVar6 = BN_num_bits((BIGNUM *)n);
                BIO_printf(a,"%d",(ulong)uVar6);
                sVar10 = BIO_ctrl(a,3,0,&ptr);
                pCVar1 = local_f8;
                Curl_ssl_push_certinfo_len(local_f8,iVar2,"RSA Public Key",ptr,sVar10);
                BIO_ctrl(a,1,0,(void *)0x0);
                pubkey_show(pCVar1,(BIO *)a,iVar2,"rsa","n",n);
                pubkey_show(pCVar1,(BIO *)a,iVar2,"rsa","e",(BIGNUM *)biomem);
                BN_clear_free((BIGNUM *)n);
                BN_clear_free((BIGNUM *)biomem);
              }
            }
            EVP_PKEY_free(pkey);
          }
          psVar14 = local_c0;
          if (psig != (ASN1_BIT_STRING *)0x0) {
            for (lVar15 = 0; lVar15 < psig->length; lVar15 = lVar15 + 1) {
              BIO_printf(a,"%02x:",(ulong)psig->data[lVar15]);
            }
            sVar10 = BIO_ctrl(a,3,0,&ptr);
            Curl_ssl_push_certinfo_len(local_f8,iVar2,"Signature",ptr,sVar10);
            BIO_ctrl(a,1,0,(void *)0x0);
          }
          PEM_write_bio_X509(a,local_d8);
          sVar10 = BIO_ctrl(a,3,0,&ptr);
          Curl_ssl_push_certinfo_len(local_f8,iVar2,"Cert",ptr,sVar10);
          BIO_ctrl(a,1,0,(void *)0x0);
        }
        BIO_free(a);
        CVar3 = CURLE_OK;
      }
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_ossl_certchain(struct Curl_easy *data, SSL *ssl)
{
  CURLcode result;
  STACK_OF(X509) *sk;
  int i;
  numcert_t numcerts;
  BIO *mem;

  DEBUGASSERT(ssl);

  sk = SSL_get_peer_cert_chain(ssl);
  if(!sk) {
    return CURLE_OUT_OF_MEMORY;
  }

  numcerts = sk_X509_num(sk);

  result = Curl_ssl_init_certinfo(data, (int)numcerts);
  if(result) {
    return result;
  }

  mem = BIO_new(BIO_s_mem());
  if(!mem) {
    return CURLE_OUT_OF_MEMORY;
  }

  for(i = 0; i < (int)numcerts; i++) {
    ASN1_INTEGER *num;
    X509 *x = sk_X509_value(sk, i);
    EVP_PKEY *pubkey = NULL;
    int j;
    char *ptr;
    const ASN1_BIT_STRING *psig = NULL;

    X509_NAME_print_ex(mem, X509_get_subject_name(x), 0, XN_FLAG_ONELINE);
    push_certinfo("Subject", i);

    X509_NAME_print_ex(mem, X509_get_issuer_name(x), 0, XN_FLAG_ONELINE);
    push_certinfo("Issuer", i);

    BIO_printf(mem, "%lx", X509_get_version(x));
    push_certinfo("Version", i);

    num = X509_get_serialNumber(x);
    if(num->type == V_ASN1_NEG_INTEGER)
      BIO_puts(mem, "-");
    for(j = 0; j < num->length; j++)
      BIO_printf(mem, "%02x", num->data[j]);
    push_certinfo("Serial Number", i);

#if defined(HAVE_X509_GET0_SIGNATURE) && defined(HAVE_X509_GET0_EXTENSIONS)
    {
      const X509_ALGOR *sigalg = NULL;
      X509_PUBKEY *xpubkey = NULL;
      ASN1_OBJECT *pubkeyoid = NULL;

      X509_get0_signature(&psig, &sigalg, x);
      if(sigalg) {
        i2a_ASN1_OBJECT(mem, sigalg->algorithm);
        push_certinfo("Signature Algorithm", i);
      }

      xpubkey = X509_get_X509_PUBKEY(x);
      if(xpubkey) {
        X509_PUBKEY_get0_param(&pubkeyoid, NULL, NULL, NULL, xpubkey);
        if(pubkeyoid) {
          i2a_ASN1_OBJECT(mem, pubkeyoid);
          push_certinfo("Public Key Algorithm", i);
        }
      }

      X509V3_ext(data, i, X509_get0_extensions(x));
    }
#else
    {
      /* before OpenSSL 1.0.2 */
      X509_CINF *cinf = x->cert_info;

      i2a_ASN1_OBJECT(mem, cinf->signature->algorithm);
      push_certinfo("Signature Algorithm", i);

      i2a_ASN1_OBJECT(mem, cinf->key->algor->algorithm);
      push_certinfo("Public Key Algorithm", i);

      X509V3_ext(data, i, cinf->extensions);

      psig = x->signature;
    }
#endif

    ASN1_TIME_print(mem, X509_get0_notBefore(x));
    push_certinfo("Start date", i);

    ASN1_TIME_print(mem, X509_get0_notAfter(x));
    push_certinfo("Expire date", i);

    pubkey = X509_get_pubkey(x);
    if(!pubkey)
      infof(data, "   Unable to load public key");
    else {
      int pktype;
#ifdef HAVE_OPAQUE_EVP_PKEY
      pktype = EVP_PKEY_id(pubkey);
#else
      pktype = pubkey->type;
#endif
      switch(pktype) {
      case EVP_PKEY_RSA:
      {
#ifndef HAVE_EVP_PKEY_GET_PARAMS
        RSA *rsa;
#ifdef HAVE_OPAQUE_EVP_PKEY
        rsa = EVP_PKEY_get0_RSA(pubkey);
#else
        rsa = pubkey->pkey.rsa;
#endif /* HAVE_OPAQUE_EVP_PKEY */
#endif /* !HAVE_EVP_PKEY_GET_PARAMS */

        {
#ifdef HAVE_OPAQUE_RSA_DSA_DH
          DECLARE_PKEY_PARAM_BIGNUM(n);
          DECLARE_PKEY_PARAM_BIGNUM(e);
#ifdef HAVE_EVP_PKEY_GET_PARAMS
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_RSA_N, &n);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_RSA_E, &e);
#else
          RSA_get0_key(rsa, &n, &e, NULL);
#endif /* HAVE_EVP_PKEY_GET_PARAMS */
          BIO_printf(mem, "%d", BN_num_bits(n));
#else
          BIO_printf(mem, "%d", BN_num_bits(rsa->n));
#endif /* HAVE_OPAQUE_RSA_DSA_DH */
          push_certinfo("RSA Public Key", i);
          print_pubkey_BN(rsa, n, i);
          print_pubkey_BN(rsa, e, i);
          FREE_PKEY_PARAM_BIGNUM(n);
          FREE_PKEY_PARAM_BIGNUM(e);
        }

        break;
      }
      case EVP_PKEY_DSA:
      {
#ifndef OPENSSL_NO_DSA
#ifndef HAVE_EVP_PKEY_GET_PARAMS
        DSA *dsa;
#ifdef HAVE_OPAQUE_EVP_PKEY
        dsa = EVP_PKEY_get0_DSA(pubkey);
#else
        dsa = pubkey->pkey.dsa;
#endif /* HAVE_OPAQUE_EVP_PKEY */
#endif /* !HAVE_EVP_PKEY_GET_PARAMS */
        {
#ifdef HAVE_OPAQUE_RSA_DSA_DH
          DECLARE_PKEY_PARAM_BIGNUM(p);
          DECLARE_PKEY_PARAM_BIGNUM(q);
          DECLARE_PKEY_PARAM_BIGNUM(g);
          DECLARE_PKEY_PARAM_BIGNUM(pub_key);
#ifdef HAVE_EVP_PKEY_GET_PARAMS
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_P, &p);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_Q, &q);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_G, &g);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_PUB_KEY, &pub_key);
#else
          DSA_get0_pqg(dsa, &p, &q, &g);
          DSA_get0_key(dsa, &pub_key, NULL);
#endif /* HAVE_EVP_PKEY_GET_PARAMS */
#endif /* HAVE_OPAQUE_RSA_DSA_DH */
          print_pubkey_BN(dsa, p, i);
          print_pubkey_BN(dsa, q, i);
          print_pubkey_BN(dsa, g, i);
          print_pubkey_BN(dsa, pub_key, i);
          FREE_PKEY_PARAM_BIGNUM(p);
          FREE_PKEY_PARAM_BIGNUM(q);
          FREE_PKEY_PARAM_BIGNUM(g);
          FREE_PKEY_PARAM_BIGNUM(pub_key);
        }
#endif /* !OPENSSL_NO_DSA */
        break;
      }
      case EVP_PKEY_DH:
      {
#ifndef HAVE_EVP_PKEY_GET_PARAMS
        DH *dh;
#ifdef HAVE_OPAQUE_EVP_PKEY
        dh = EVP_PKEY_get0_DH(pubkey);
#else
        dh = pubkey->pkey.dh;
#endif /* HAVE_OPAQUE_EVP_PKEY */
#endif /* !HAVE_EVP_PKEY_GET_PARAMS */
        {
#ifdef HAVE_OPAQUE_RSA_DSA_DH
          DECLARE_PKEY_PARAM_BIGNUM(p);
          DECLARE_PKEY_PARAM_BIGNUM(q);
          DECLARE_PKEY_PARAM_BIGNUM(g);
          DECLARE_PKEY_PARAM_BIGNUM(pub_key);
#ifdef HAVE_EVP_PKEY_GET_PARAMS
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_P, &p);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_Q, &q);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_G, &g);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_PUB_KEY, &pub_key);
#else
          DH_get0_pqg(dh, &p, &q, &g);
          DH_get0_key(dh, &pub_key, NULL);
#endif /* HAVE_EVP_PKEY_GET_PARAMS */
          print_pubkey_BN(dh, p, i);
          print_pubkey_BN(dh, q, i);
          print_pubkey_BN(dh, g, i);
#else
          print_pubkey_BN(dh, p, i);
          print_pubkey_BN(dh, g, i);
#endif /* HAVE_OPAQUE_RSA_DSA_DH */
          print_pubkey_BN(dh, pub_key, i);
          FREE_PKEY_PARAM_BIGNUM(p);
          FREE_PKEY_PARAM_BIGNUM(q);
          FREE_PKEY_PARAM_BIGNUM(g);
          FREE_PKEY_PARAM_BIGNUM(pub_key);
       }
        break;
      }
      }
      EVP_PKEY_free(pubkey);
    }

    if(psig) {
      for(j = 0; j < psig->length; j++)
        BIO_printf(mem, "%02x:", psig->data[j]);
      push_certinfo("Signature", i);
    }

    PEM_write_bio_X509(mem, x);
    push_certinfo("Cert", i);
  }

  BIO_free(mem);

  return CURLE_OK;
}